

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_37e72::TestNotifiesReporterOfCheckFailureWithCorrectInfo::RunImpl
          (TestNotifiesReporterOfCheckFailureWithCorrectInfo *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int local_874;
  TestDetails local_870;
  TestResults results;
  RecordingReporter reporter;
  
  reporter.super_TestReporter._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150820;
  reporter.testRunCount = 0;
  reporter.testFailedCount = 0;
  reporter.lastFailedLine = 0;
  reporter.testFinishedCount = 0;
  reporter.lastStartedSuite[0] = '\0';
  reporter.lastStartedTest[0] = '\0';
  reporter.lastFailedFile[0] = '\0';
  reporter.lastFailedSuite[0] = '\0';
  reporter.lastFailedTest[0] = '\0';
  reporter.lastFailedMessage[0] = '\0';
  reporter.lastFinishedSuite[0] = '\0';
  reporter.lastFinishedTest[0] = '\0';
  reporter.lastFinishedTestTime = 0.0;
  reporter.summaryTotalTestCount = 0;
  reporter.summaryFailedTestCount = 0;
  reporter.summaryFailureCount = 0;
  reporter.summarySecondsElapsed = 0.0;
  UnitTest::TestResults::TestResults(&results,&reporter.super_TestReporter);
  UnitTest::TestResults::OnTestFailure
            (&results,(TestDetails *)(anonymous_namespace)::details,"failurestring");
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_874 = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x59);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_874,&reporter.testFailedCount,&local_870);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x5b);
  UnitTest::CheckEqual(pTVar1,"filename",reporter.lastFailedFile,&local_870);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_874 = 0x7b;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x5c);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_874,&reporter.lastFailedLine,&local_870);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x5d);
  UnitTest::CheckEqual(pTVar1,"testname",reporter.lastFailedTest,&local_870);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x5e);
  UnitTest::CheckEqual(pTVar1,"suitename",reporter.lastFailedSuite,&local_870);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x5f);
  UnitTest::CheckEqual(pTVar1,"failurestring",reporter.lastFailedMessage,&local_870);
  UnitTest::TestReporter::~TestReporter(&reporter.super_TestReporter);
  return;
}

Assistant:

TEST(RecordsNumbersOfTests)
{
    TestResults results;
    results.OnTestStart(details);
    results.OnTestStart(details);
    results.OnTestStart(details);
    CHECK_EQUAL(3, results.GetTotalTestCount());
}